

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O0

Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *
wasm::WATParser::anon_unknown_22::wastModule
          (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
           *__return_storage_ptr__,Lexer *in,bool maybeInvalid)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  element_type *wasm_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool local_4b1;
  QuotedModule local_460;
  allocator<char> local_431;
  string local_430;
  Err local_410;
  undefined1 local_3f0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s;
  stringstream ss;
  ostream local_3b8 [376];
  Err local_240;
  Err *local_220;
  Err *err;
  Result<wasm::Ok> _val;
  shared_ptr<wasm::Module> wasm;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string_view local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  string local_190 [8];
  string mod;
  string local_168;
  Err local_148;
  int local_124;
  undefined1 auStack_120 [4];
  int count;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  QuotedModuleType local_fc;
  undefined1 local_f8 [4];
  QuotedModuleType type;
  optional<wasm::Name> id;
  string local_d8;
  Err local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined1 local_78 [8];
  Lexer reset;
  bool maybeInvalid_local;
  Lexer *in_local;
  
  reset.buffer._M_str._7_1_ = maybeInvalid;
  Lexer::Lexer((Lexer *)local_78,in);
  local_88 = sv("module",6);
  bVar1 = Lexer::takeSExprStart(in,local_88);
  if (bVar1) {
    Lexer::takeID((optional<wasm::Name> *)local_f8,in);
    local_110 = sv("quote",5);
    bVar1 = Lexer::takeKeyword(in,local_110);
    if (bVar1) {
      local_fc = Text;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_120,"binary");
      bVar1 = Lexer::takeKeyword(in,_auStack_120);
      if (!bVar1) {
        if ((reset.buffer._M_str._7_1_ & 1) == 0) {
          Lexer::operator=(in,(Lexer *)local_78);
          std::make_shared<wasm::Module>();
          wasm_00 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          parseModule((Result<wasm::Ok> *)&err,wasm_00,in);
          local_220 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_engaged = local_220 != (Err *)0x0;
          if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged) {
            wasm::Err::Err(&local_240,local_220);
            Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>::
            Result(__return_storage_ptr__,&local_240);
            wasm::Err::~Err(&local_240);
          }
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._17_3_ = 0;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
          if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._16_4_ == 0) {
            Result<std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>>::
            Result<std::shared_ptr<wasm::Module>>
                      ((Result<std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>>
                        *)__return_storage_ptr__,
                       (shared_ptr<wasm::Module> *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._M_engaged = true;
            id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._17_3_ = 0;
          }
          std::shared_ptr<wasm::Module>::~shared_ptr
                    ((shared_ptr<wasm::Module> *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        else {
          local_124 = 1;
          while( true ) {
            while( true ) {
              local_4b1 = false;
              if (local_124 != 0) {
                local_4b1 = Lexer::takeUntilParen(in);
              }
              if (local_4b1 == false) {
                local_1b0 = Lexer::next((Lexer *)local_78);
                sVar2 = Lexer::getPos(in);
                sVar3 = Lexer::getPos((Lexer *)local_78);
                local_1a0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                      (&local_1b0,0,sVar2 - sVar3);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          (local_190,&local_1a0,&local_1b1);
                std::allocator<char>::~allocator(&local_1b1);
                wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_4_ = 0;
                std::__cxx11::string::string(local_1d8,local_190);
                Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
                ::Result<wasm::WATParser::QuotedModule>
                          (__return_storage_ptr__,
                           (QuotedModule *)
                           &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                QuotedModule::~QuotedModule
                          ((QuotedModule *)
                           &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged = true;
                id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._17_3_ = 0;
                std::__cxx11::string::~string(local_190);
                goto LAB_025089a5;
              }
              bVar1 = Lexer::takeLParen(in);
              if (!bVar1) break;
              local_124 = local_124 + 1;
            }
            bVar1 = Lexer::takeRParen(in);
            if (!bVar1) break;
            local_124 = local_124 + -1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_168,"unexpected end of script",
                     (allocator<char> *)(mod.field_2._M_local_buf + 0xf));
          Lexer::err(&local_148,in,&local_168);
          Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>::
          Result(__return_storage_ptr__,&local_148);
          wasm::Err::~Err(&local_148);
          std::__cxx11::string::~string((string *)&local_168);
          std::allocator<char>::~allocator((allocator<char> *)(mod.field_2._M_local_buf + 0xf));
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_engaged = true;
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._17_3_ = 0;
        }
        goto LAB_025089a5;
      }
      local_fc = Binary;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &s.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged);
    do {
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_3f0,in);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_3f0);
      if (bVar1) {
        pbVar4 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3f0);
        std::operator<<(local_3b8,(string *)pbVar4);
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_engaged = false;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._17_3_ = 0;
      }
      else {
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_engaged = true;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._17_3_ = 0;
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3f0);
    } while (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_4_ == 0);
    bVar1 = Lexer::takeRParen(in);
    if (bVar1) {
      local_460.type = local_fc;
      std::__cxx11::stringstream::str();
      Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>::
      Result<wasm::WATParser::QuotedModule>(__return_storage_ptr__,&local_460);
      QuotedModule::~QuotedModule(&local_460);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"expected end of module",&local_431);
      Lexer::err(&local_410,in,&local_430);
      Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>::Result
                (__return_storage_ptr__,&local_410);
      wasm::Err::~Err(&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
    }
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = true;
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._17_3_ = 0;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &s.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"expected module",
               (allocator<char> *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>.field_0x17);
    Lexer::err(&local_b8,in,&local_d8);
    Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>::Result
              (__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>.field_0x17);
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = true;
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._17_3_ = 0;
  }
LAB_025089a5:
  Lexer::~Lexer((Lexer *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Result<WASTModule> wastModule(Lexer& in, bool maybeInvalid = false) {
  Lexer reset = in;
  if (!in.takeSExprStart("module"sv)) {
    return in.err("expected module");
  }
  // TODO: use ID?
  [[maybe_unused]] auto id = in.takeID();
  QuotedModuleType type;
  if (in.takeKeyword("quote"sv)) {
    type = QuotedModuleType::Text;
  } else if (in.takeKeyword("binary")) {
    type = QuotedModuleType::Binary;
  } else if (maybeInvalid) {
    // This is not a quoted text or binary module, so it must be a normal inline
    // module, but we might not be able to parse it. Treat it as through it were
    // a quoted module instead.
    int count = 1;
    while (count && in.takeUntilParen()) {
      if (in.takeLParen()) {
        ++count;
      } else if (in.takeRParen()) {
        --count;
      } else {
        return in.err("unexpected end of script");
      }
    }
    std::string mod(reset.next().substr(0, in.getPos() - reset.getPos()));
    return QuotedModule{QuotedModuleType::Text, mod};
  } else {
    // This is a normal inline module that should be parseable. Reset to the
    // start and parse it normally.
    in = std::move(reset);
    auto wasm = std::make_shared<Module>();
    CHECK_ERR(parseModule(*wasm, in));
    return wasm;
  }

  // We have a quote or binary module. Collect its contents.
  std::stringstream ss;
  while (auto s = in.takeString()) {
    ss << *s;
  }

  if (!in.takeRParen()) {
    return in.err("expected end of module");
  }

  return QuotedModule{type, ss.str()};
}